

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int array_container_index_equalorlarger(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  bool bVar2;
  uint in_EDX;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = arr->cardinality + -1;
  uVar4 = 0;
  do {
    if (iVar5 < (int)uVar4) {
      uVar3 = ~uVar4;
      break;
    }
    uVar3 = uVar4 + iVar5 >> 1;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar4 + iVar5 & 0xfffffffe));
    if (uVar1 < x) {
      uVar4 = uVar3 + 1;
      bVar2 = true;
      uVar3 = in_EDX;
    }
    else if (x < uVar1) {
      iVar5 = uVar3 - 1;
      bVar2 = true;
      uVar3 = in_EDX;
    }
    else {
      bVar2 = false;
    }
    in_EDX = uVar3;
  } while (bVar2);
  uVar4 = 0xffffffff;
  if ((int)~uVar3 < arr->cardinality) {
    uVar4 = ~uVar3;
  }
  if (-1 < (int)uVar3) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

inline int array_container_index_equalorlarger(const array_container_t *arr,
                                               uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        int32_t candidate = -idx - 1;
        if (candidate < arr->cardinality) return candidate;
        return -1;
    }
}